

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls_openssl.cpp
# Opt level: O1

int q_dgram_write(BIO *bio,char *src,int bytesToWrite)

{
  long lVar1;
  QByteArray *pQVar2;
  int iVar3;
  QLoggingCategory *pQVar4;
  void *pvVar5;
  long lVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((src == (char *)0x0 || bio == (BIO *)0x0) || bytesToWrite < 1) {
    pQVar4 = lcTlsBackend();
    bytesToWrite = 0;
    if (((pQVar4->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      q_dgram_write_cold_1();
    }
  }
  else {
    q_BIO_clear_flags(bio,0xf);
    pvVar5 = q_BIO_get_ex_data(bio,0);
    if (*(char *)((long)pvVar5 + 0x80) == '\0') {
      pQVar2 = *(QByteArray **)((long)pvVar5 + 0x78);
      iVar3 = QAbstractSocket::state();
      if (iVar3 == 3) {
        lVar6 = QIODevice::write(pQVar2);
      }
      else {
        if (src == (char *)0x0) {
          src = (char *)&QByteArray::_empty;
        }
        lVar6 = QUdpSocket::writeDatagram
                          ((char *)pQVar2,(longlong)src,(QHostAddress *)(ulong)(uint)bytesToWrite,
                           (short)pvVar5 + 0x48);
      }
      bytesToWrite = (int)lVar6;
      if (lVar6 < 1) {
        q_BIO_set_flags(bio,10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bytesToWrite;
  }
  __stack_chk_fail();
}

Assistant:

int q_dgram_write(BIO *bio, const char *src, int bytesToWrite)
{
    if (!bio || !src || bytesToWrite <= 0) {
        qCWarning(lcTlsBackend, "invalid input parameter(s)");
        return 0;
    }

    q_BIO_clear_retry_flags(bio);

    auto dtls = static_cast<dtlsopenssl::DtlsState *>(q_BIO_get_app_data(bio));
    Q_ASSERT(dtls);
    if (dtls->writeSuppressed) {
        // See the comment in QDtls::startHandshake.
        return bytesToWrite;
    }

    QUdpSocket *udpSocket = dtls->udpSocket;
    Q_ASSERT(udpSocket);

    const QByteArray dgram(QByteArray::fromRawData(src, bytesToWrite));
    qint64 bytesWritten = -1;
    if (udpSocket->state() == QAbstractSocket::ConnectedState) {
        bytesWritten = udpSocket->write(dgram);
    } else {
        bytesWritten = udpSocket->writeDatagram(dgram, dtls->remoteAddress,
                                                dtls->remotePort);
    }

    if (bytesWritten <= 0)
        q_BIO_set_retry_write(bio);

    Q_ASSERT(bytesWritten <= std::numeric_limits<int>::max());
    return int(bytesWritten);
}